

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::queue_up(torrent *this)

{
  bool bVar1;
  queue_position_t v;
  strong_typedef<int,_libtorrent::queue_position_tag,_void> local_1c;
  strong_typedef<int,_libtorrent::queue_position_tag,_void> local_18;
  queue_position_t local_14;
  torrent *local_10;
  torrent *this_local;
  
  if (((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1a & 1) == 0) &&
     (local_10 = this, bVar1 = is_finished(this), !bVar1)) {
    local_18.m_val = (int)queue_position(this);
    strong_typedef<int,_libtorrent::queue_position_tag,_void>::strong_typedef(&local_1c,0);
    bVar1 = strong_typedef<int,_libtorrent::queue_position_tag,_void>::operator==
                      (&local_18,&local_1c);
    if (bVar1) {
      local_14 = queue_position(this);
    }
    else {
      v = queue_position(this);
      local_14.m_val = (int)prev<int,libtorrent::queue_position_tag>(v.m_val);
    }
    set_queue_position(this,local_14);
  }
  return;
}

Assistant:

void torrent::queue_up()
	{
		// finished torrents may not change their queue positions, as it's set to
		// -1
		if (m_abort || is_finished()) return;

		set_queue_position(queue_position() == queue_position_t{0}
			? queue_position() : prev(queue_position()));
	}